

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

natwm_error array_find_value_items_string(parser *parser,char *string,char **result,size_t *length)

{
  size_t string_00;
  parser_token pVar1;
  natwm_error nVar2;
  size_t sVar3;
  size_t sStack_60;
  natwm_error err;
  size_t array_value_items_string_size;
  char *array_value_items_string;
  char *pcStack_48;
  natwm_error err_1;
  char *line;
  size_t end_pos;
  char *array_value_string;
  size_t *length_local;
  char **result_local;
  char *string_local;
  parser *parser_local;
  
  end_pos = 0;
  array_value_string = (char *)length;
  length_local = (size_t *)result;
  result_local = (char **)string;
  string_local = (char *)parser;
  sVar3 = strlen(string);
  pVar1 = char_to_token(string[sVar3 - 1]);
  if (pVar1 == ARRAY_END) {
    end_pos = (size_t)string_init((char *)result_local);
  }
  else {
    line = (char *)0x0;
    pcStack_48 = (char *)(*(long *)string_local + *(long *)(string_local + 0x10));
    array_value_items_string._4_4_ = get_array_string(pcStack_48,(char **)&end_pos,(size_t *)&line);
    if (array_value_items_string._4_4_ != NO_ERROR) {
      internal_logger(natwm_logger,LEVEL_ERROR,
                      "Could not find \']\' in array value string - Line %zu",
                      *(undefined8 *)(string_local + 0x18));
      return INVALID_INPUT_ERROR;
    }
    parser_move((parser *)string_local,(size_t)line);
  }
  string_00 = end_pos;
  array_value_items_string_size = 0;
  sStack_60 = 0;
  sVar3 = strlen((char *)end_pos);
  nVar2 = string_splice((char *)string_00,1,sVar3 - 1,(char **)&array_value_items_string_size,
                        &stack0xffffffffffffffa0);
  if (nVar2 == NO_ERROR) {
    free((void *)end_pos);
    *length_local = array_value_items_string_size;
    *(size_t *)array_value_string = sStack_60;
    parser_local._4_4_ = NO_ERROR;
  }
  else {
    free((void *)end_pos);
    parser_local._4_4_ = nVar2;
  }
  return parser_local._4_4_;
}

Assistant:

static enum natwm_error array_find_value_items_string(struct parser *parser, char *string,
                                                      char **result, size_t *length)
{
        // An array value string in the format
        // [<value>,<value>]
        char *array_value_string = NULL;

        if (char_to_token(string[strlen(string) - 1]) != ARRAY_END) {
                size_t end_pos = 0;
                const char *line = parser->buffer + parser->pos;

                enum natwm_error err = get_array_string(line, &array_value_string, &end_pos);

                if (err != NO_ERROR) {
                        LOG_ERROR(natwm_logger,
                                  "Could not find ']' in array value string - "
                                  "Line %zu",
                                  parser->line_num);

                        return INVALID_INPUT_ERROR;
                }

                // We found a valid multiline array value string. But now we
                // need to update the parser position to point to the end of the
                // array value string
                parser_move(parser, end_pos);
        } else {
                // Our array exists on a single line
                array_value_string = string_init(string);
        }

        // From our value string we need to get the array items list
        // <value>,<value>
        char *array_value_items_string = NULL;
        size_t array_value_items_string_size = 0;
        enum natwm_error err = string_splice(array_value_string,
                                             1,
                                             strlen(array_value_string) - 1,
                                             &array_value_items_string,
                                             &array_value_items_string_size);

        if (err != NO_ERROR) {
                free(array_value_string);

                return err;
        }

        free(array_value_string);

        *result = array_value_items_string;
        *length = array_value_items_string_size;

        return NO_ERROR;
}